

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Neuron_testConnectTo_Test::TestBody(Neuron_testConnectTo_Test *this)

{
  Connections *pCVar1;
  char *pcVar2;
  AssertHelper local_108;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  AssertionResult gtest_ar;
  Neuron n1;
  Neuron n2;
  
  Neuron::Neuron(&n1,10.0,1.0,50.0);
  Neuron::Neuron(&n2,10.0,1.0,50.0);
  local_108.data_._0_4_ = 0;
  pCVar1 = Neuron::connections(&n1);
  local_100.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x18);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","n1.connections().size()",(int *)&local_108,
             (unsigned_long *)&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Neuron::connectTo(&n1,&n2,50.0);
  local_108.data_._0_4_ = 1;
  pCVar1 = Neuron::connections(&n1);
  local_100.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x18);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"1","n1.connections().size()",(int *)&local_108,
             (unsigned_long *)&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_108.data_._0_4_ = 0;
  pCVar1 = Neuron::connections(&n2);
  local_100.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(pCVar1->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x18);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","n2.connections().size()",(int *)&local_108,
             (unsigned_long *)&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Neuron::~Neuron(&n2);
  Neuron::~Neuron(&n1);
  return;
}

Assistant:

TEST(Neuron, testConnectTo)
{
    Neuron n1;
    Neuron n2;

    EXPECT_EQ(0, n1.connections().size());

    n1.connectTo(&n2, 50.0f);

    EXPECT_EQ(1, n1.connections().size());
    EXPECT_EQ(0, n2.connections().size());
}